

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_che.c
# Opt level: O0

void beltCHEStepG_internal(void *state)

{
  u64 *in_RDI;
  word *unaff_retaddr;
  belt_che_st *st;
  undefined7 in_stack_ffffffffffffffe8;
  octet in_stack_ffffffffffffffef;
  u64 *puVar1;
  
  puVar1 = in_RDI;
  if (in_RDI[0x12] == 0) {
    memCopy(in_RDI,(void *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),0x158d95);
  }
  else {
    memSet(in_RDI,in_stack_ffffffffffffffef,0x158d03);
    u64From(in_RDI,(void *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),0x158d1f);
    in_RDI[10] = in_RDI[8] ^ in_RDI[10];
    in_RDI[0xb] = in_RDI[9] ^ in_RDI[0xb];
    beltPolyMul((word *)state,(word *)st,unaff_retaddr,puVar1);
  }
  in_RDI[10] = in_RDI[0xc] ^ in_RDI[10];
  in_RDI[0xb] = in_RDI[0xd] ^ in_RDI[0xb];
  beltPolyMul((word *)state,(word *)st,unaff_retaddr,puVar1);
  beltBlockEncr((octet *)(in_RDI + 10),(u32 *)in_RDI);
  return;
}

Assistant:

static void beltCHEStepG_internal(void* state)
{
	belt_che_st* st = (belt_che_st*)state;
	ASSERT(memIsValid(state, beltCHE_keep()));
	// создать копию t и завершить обработку данных
	if (st->filled)
	{
		memSetZero(st->block + st->filled, 16 - st->filled);
		wwFrom(st->t1, st->block, 16);
		beltBlockXor2(st->t1, st->t);
		beltPolyMul(st->t1, st->t1, st->r, st->stack);
	}
	else
		memCopy(st->t1, st->t, 16);
	// обработать блок длины
	beltBlockXor2(st->t1, st->len);
	beltPolyMul(st->t1, st->t1, st->r, st->stack);
#if (OCTET_ORDER == BIG_ENDIAN)
	beltBlockRevW(st->t1);
#endif
	beltBlockEncr((octet*)st->t1, st->key);
}